

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkreply.cpp
# Opt level: O0

qint64 __thiscall
QHttpNetworkReplyPrivate::readHeader(QHttpNetworkReplyPrivate *this,QIODevice *socket)

{
  QByteArrayView header;
  QByteArrayView bv;
  QByteArrayView bv_00;
  QByteArrayView bv_01;
  QByteArrayView bv_02;
  QByteArrayView bv_03;
  QByteArrayView bv_04;
  QByteArrayView bv_05;
  QByteArrayView bv_06;
  QByteArrayView name;
  QByteArrayView name_00;
  QByteArrayView name_01;
  QByteArrayView name_02;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  qsizetype qVar7;
  qint64 qVar8;
  QHttpNetworkHeaderPrivate *this_00;
  QByteArrayView *this_01;
  char *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  qint64 haveRead;
  bool allHeaders;
  qint64 bytes;
  QByteArray connectionHeaderField;
  char c;
  QHttpNetworkReplyPrivate *in_stack_fffffffffffffd68;
  uint6 in_stack_fffffffffffffd78;
  undefined1 in_stack_fffffffffffffd7e;
  byte bVar9;
  undefined1 in_stack_fffffffffffffd7f;
  byte bVar10;
  QByteArrayView *in_stack_fffffffffffffd80;
  QHttpNetworkHeaderPrivate *in_stack_fffffffffffffd88;
  undefined8 in_stack_fffffffffffffd90;
  undefined6 in_stack_fffffffffffffd98;
  undefined1 in_stack_fffffffffffffd9e;
  undefined1 in_stack_fffffffffffffd9f;
  bool local_234;
  undefined7 in_stack_fffffffffffffdd8;
  byte bVar11;
  long local_220;
  long local_208;
  char local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = QByteArray::isEmpty((QByteArray *)0x305665);
  if (bVar3) {
    QByteArray::reserve((QByteArray *)in_stack_fffffffffffffd80,
                        CONCAT17(in_stack_fffffffffffffd9f,
                                 CONCAT16(in_stack_fffffffffffffd9e,in_stack_fffffffffffffd98)));
  }
  local_220 = 0;
  local_9 = '\0';
  bVar11 = 0;
  do {
    lVar6 = QIODevice::read(in_RSI,(longlong)&local_9);
    if (lVar6 == 0) break;
    if (lVar6 == -1) {
      local_208 = -1;
      goto LAB_00305d83;
    }
    QByteArray::append((char)in_RDI + ' ');
    local_220 = local_220 + 1;
    if (local_9 == '\n') {
      QByteArrayView::QByteArrayView<4ul>
                (in_stack_fffffffffffffd80,
                 (char (*) [4])
                 CONCAT17(in_stack_fffffffffffffd7f,
                          CONCAT16(in_stack_fffffffffffffd7e,in_stack_fffffffffffffd78)));
      bv_03.m_data._0_6_ = in_stack_fffffffffffffd98;
      bv_03.m_size = in_stack_fffffffffffffd90;
      bv_03.m_data._6_1_ = in_stack_fffffffffffffd9e;
      bv_03.m_data._7_1_ = in_stack_fffffffffffffd9f;
      bVar3 = QByteArray::endsWith
                        ((QByteArray *)
                         CONCAT17(in_stack_fffffffffffffd7f,
                                  CONCAT16(in_stack_fffffffffffffd7e,in_stack_fffffffffffffd78)),
                         bv_03);
      if (bVar3) {
LAB_003057a3:
        bVar11 = 1;
      }
      else {
        QByteArrayView::QByteArrayView<3ul>
                  (in_stack_fffffffffffffd80,
                   (char (*) [3])
                   CONCAT17(in_stack_fffffffffffffd7f,
                            CONCAT16(in_stack_fffffffffffffd7e,in_stack_fffffffffffffd78)));
        bv_04.m_data._0_6_ = in_stack_fffffffffffffd98;
        bv_04.m_size = in_stack_fffffffffffffd90;
        bv_04.m_data._6_1_ = in_stack_fffffffffffffd9e;
        bv_04.m_data._7_1_ = in_stack_fffffffffffffd9f;
        bVar3 = QByteArray::endsWith
                          ((QByteArray *)
                           CONCAT17(in_stack_fffffffffffffd7f,
                                    CONCAT16(in_stack_fffffffffffffd7e,in_stack_fffffffffffffd78)),
                           bv_04);
        if (bVar3) goto LAB_003057a3;
      }
      qVar7 = QByteArray::size((QByteArray *)(in_RDI + 0x120));
      if (qVar7 == 2) {
        QByteArrayView::QByteArrayView<3ul>
                  (in_stack_fffffffffffffd80,
                   (char (*) [3])
                   CONCAT17(in_stack_fffffffffffffd7f,
                            CONCAT16(in_stack_fffffffffffffd7e,in_stack_fffffffffffffd78)));
        bv_05.m_data._0_6_ = in_stack_fffffffffffffd98;
        bv_05.m_size = in_stack_fffffffffffffd90;
        bv_05.m_data._6_1_ = in_stack_fffffffffffffd9e;
        bv_05.m_data._7_1_ = in_stack_fffffffffffffd9f;
        bVar3 = QByteArray::endsWith
                          ((QByteArray *)
                           CONCAT17(in_stack_fffffffffffffd7f,
                                    CONCAT16(in_stack_fffffffffffffd7e,in_stack_fffffffffffffd78)),
                           bv_05);
        if (!bVar3) goto LAB_00305801;
LAB_0030585c:
        bVar11 = 1;
      }
      else {
LAB_00305801:
        qVar7 = QByteArray::size((QByteArray *)(in_RDI + 0x120));
        if (qVar7 == 1) {
          QByteArrayView::QByteArrayView<2ul>
                    (in_stack_fffffffffffffd80,
                     (char (*) [2])
                     CONCAT17(in_stack_fffffffffffffd7f,
                              CONCAT16(in_stack_fffffffffffffd7e,in_stack_fffffffffffffd78)));
          bv_06.m_data._0_6_ = in_stack_fffffffffffffd98;
          bv_06.m_size = in_stack_fffffffffffffd90;
          bv_06.m_data._6_1_ = in_stack_fffffffffffffd9e;
          bv_06.m_data._7_1_ = in_stack_fffffffffffffd9f;
          bVar3 = QByteArray::endsWith
                            ((QByteArray *)
                             CONCAT17(in_stack_fffffffffffffd7f,
                                      CONCAT16(in_stack_fffffffffffffd7e,in_stack_fffffffffffffd78))
                             ,bv_06);
          if (bVar3) goto LAB_0030585c;
        }
      }
    }
    in_stack_fffffffffffffd9f = (bVar11 & 1) == 0 && 0 < lVar6;
  } while ((bool)in_stack_fffffffffffffd9f);
  if ((bVar11 & 1) != 0) {
    QByteArrayView::QByteArrayView<QByteArray,_true>
              (in_stack_fffffffffffffd80,
               (QByteArray *)
               CONCAT17(in_stack_fffffffffffffd7f,
                        CONCAT16(in_stack_fffffffffffffd7e,in_stack_fffffffffffffd78)));
    header.m_data = (storage_type *)in_stack_fffffffffffffd88;
    header.m_size = (qsizetype)in_stack_fffffffffffffd80;
    parseHeader(in_stack_fffffffffffffd68,header);
    *(undefined4 *)(in_RDI + 0xd0) = 3;
    QByteArray::clear();
    qVar8 = QHttpNetworkHeaderPrivate::contentLength(in_stack_fffffffffffffd88);
    *(qint64 *)(in_RDI + 0x108) = qVar8;
    this_00 = (QHttpNetworkHeaderPrivate *)(in_RDI + 0x78);
    QByteArrayView::QByteArrayView<18ul>
              (in_stack_fffffffffffffd80,
               (char (*) [18])
               CONCAT17(in_stack_fffffffffffffd7f,
                        CONCAT16(in_stack_fffffffffffffd7e,in_stack_fffffffffffffd78)));
    QByteArray::QByteArray((QByteArray *)0x30592f);
    name.m_data._0_7_ = in_stack_fffffffffffffdd8;
    name.m_size = lVar6;
    name.m_data._7_1_ = bVar11;
    QHttpNetworkHeaderPrivate::headerField(this_00,name,(QByteArray *)in_stack_fffffffffffffd80);
    QByteArray::toLower((QByteArray *)in_stack_fffffffffffffd68);
    QByteArrayView::QByteArrayView<8ul>
              (in_stack_fffffffffffffd80,
               (char (*) [8])
               CONCAT17(in_stack_fffffffffffffd7f,
                        CONCAT16(in_stack_fffffffffffffd7e,in_stack_fffffffffffffd78)));
    bv.m_data = (storage_type *)this_00;
    bv.m_size = (qsizetype)in_stack_fffffffffffffd80;
    bVar3 = QByteArray::contains((QByteArray *)in_stack_fffffffffffffd68,bv);
    *(bool *)(in_RDI + 0x138) = bVar3;
    QByteArray::~QByteArray((QByteArray *)0x3059bc);
    QByteArray::~QByteArray((QByteArray *)0x3059c9);
    QByteArray::~QByteArray((QByteArray *)0x3059d6);
    QByteArrayView::QByteArrayView<11ul>
              (in_stack_fffffffffffffd80,
               (char (*) [11])
               CONCAT17(in_stack_fffffffffffffd7f,
                        CONCAT16(in_stack_fffffffffffffd7e,in_stack_fffffffffffffd78)));
    QByteArray::QByteArray((QByteArray *)0x305a32);
    name_00.m_data._0_7_ = in_stack_fffffffffffffdd8;
    name_00.m_size = lVar6;
    name_00.m_data._7_1_ = bVar11;
    QHttpNetworkHeaderPrivate::headerField(this_00,name_00,(QByteArray *)in_stack_fffffffffffffd80);
    QByteArray::~QByteArray((QByteArray *)0x305a69);
    QByteArray::toLower((QByteArray *)in_stack_fffffffffffffd68);
    QByteArrayView::QByteArrayView<6ul>
              (in_stack_fffffffffffffd80,
               (char (*) [6])
               CONCAT17(in_stack_fffffffffffffd7f,
                        CONCAT16(in_stack_fffffffffffffd7e,in_stack_fffffffffffffd78)));
    bv_00.m_data = (storage_type *)this_00;
    bv_00.m_size = (qsizetype)in_stack_fffffffffffffd80;
    bVar4 = QByteArray::contains((QByteArray *)in_stack_fffffffffffffd68,bv_00);
    bVar2 = false;
    bVar1 = false;
    bVar3 = false;
    local_234 = false;
    bVar9 = 1;
    if (!bVar4) {
      this_01 = (QByteArrayView *)(in_RDI + 0x78);
      QByteArrayView::QByteArrayView<17ul>
                (this_01,(char (*) [17])
                         CONCAT17(in_stack_fffffffffffffd7f,
                                  CONCAT16(in_stack_fffffffffffffd7e,in_stack_fffffffffffffd78)));
      QByteArray::QByteArray((QByteArray *)0x305b0d);
      bVar2 = true;
      name_01.m_data._0_7_ = in_stack_fffffffffffffdd8;
      name_01.m_size = lVar6;
      name_01.m_data._7_1_ = bVar11;
      QHttpNetworkHeaderPrivate::headerField(this_00,name_01,(QByteArray *)this_01);
      bVar1 = true;
      QByteArray::toLower((QByteArray *)in_stack_fffffffffffffd68);
      bVar3 = true;
      QByteArrayView::QByteArrayView<6ul>
                (this_01,(char (*) [6])
                         CONCAT17(in_stack_fffffffffffffd7f,
                                  CONCAT16(in_stack_fffffffffffffd7e,in_stack_fffffffffffffd78)));
      bv_01.m_data = (storage_type *)this_00;
      bv_01.m_size = (qsizetype)this_01;
      bVar4 = QByteArray::contains((QByteArray *)in_stack_fffffffffffffd68,bv_01);
      bVar9 = 1;
      if (!bVar4) {
        iVar5 = QHttpHeaderParser::getMajorVersion((QHttpHeaderParser *)(in_RDI + 0x88));
        bVar9 = 0;
        if (iVar5 == 1) {
          iVar5 = QHttpHeaderParser::getMinorVersion((QHttpHeaderParser *)(in_RDI + 0x88));
          bVar10 = 0;
          bVar9 = bVar10;
          if (iVar5 == 0) {
            local_234 = QByteArray::isEmpty((QByteArray *)0x305bf0);
            bVar9 = 0;
            if (local_234) {
              QByteArrayView::QByteArrayView<17ul>
                        (this_01,(char (*) [17])CONCAT17(bVar10,(uint7)in_stack_fffffffffffffd78));
              QByteArray::QByteArray((QByteArray *)0x305c31);
              name_02.m_data._0_7_ = in_stack_fffffffffffffdd8;
              name_02.m_size = lVar6;
              name_02.m_data._7_1_ = bVar11;
              QHttpNetworkHeaderPrivate::headerField(this_00,name_02,(QByteArray *)this_01);
              QByteArray::toLower((QByteArray *)in_stack_fffffffffffffd68);
              QByteArrayView::QByteArrayView<11ul>
                        (this_01,(char (*) [11])
                                 CONCAT17(bVar10,CONCAT16(bVar9,in_stack_fffffffffffffd78)));
              bv_02.m_data = (storage_type *)this_00;
              bv_02.m_size = (qsizetype)this_01;
              bVar4 = QByteArray::contains((QByteArray *)in_stack_fffffffffffffd68,bv_02);
              bVar9 = bVar4 ^ 0xff;
            }
          }
        }
      }
    }
    *(byte *)(in_RDI + 0x139) = bVar9 & 1;
    if (local_234 != false) {
      QByteArray::~QByteArray((QByteArray *)0x305cee);
      QByteArray::~QByteArray((QByteArray *)0x305d04);
      QByteArray::~QByteArray((QByteArray *)0x305d1a);
    }
    if (bVar3) {
      QByteArray::~QByteArray((QByteArray *)0x305d30);
    }
    if (bVar1) {
      QByteArray::~QByteArray((QByteArray *)0x305d46);
    }
    if (bVar2) {
      QByteArray::~QByteArray((QByteArray *)0x305d5c);
    }
    QByteArray::~QByteArray((QByteArray *)0x305d69);
    QByteArray::~QByteArray((QByteArray *)0x305d76);
  }
  local_208 = local_220;
LAB_00305d83:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_208;
}

Assistant:

qint64 QHttpNetworkReplyPrivate::readHeader(QIODevice *socket)
{
    if (fragment.isEmpty()) {
        // according to http://dev.opera.com/articles/view/mama-http-headers/ the average size of the header
        // block is 381 bytes.
        // reserve bytes. This is better than always append() which reallocs the byte array.
        fragment.reserve(512);
    }

    qint64 bytes = 0;
    char c = 0;
    bool allHeaders = false;
    qint64 haveRead = 0;
    do {
        haveRead = socket->read(&c, 1);
        if (haveRead == 0) {
            // read more later
            break;
        } else if (haveRead == -1) {
            // connection broke down
            return -1;
        } else {
            fragment.append(c);
            bytes++;

            if (c == '\n') {
                // check for possible header endings. As per HTTP rfc,
                // the header endings will be marked by CRLFCRLF. But
                // we will allow CRLFCRLF, CRLFLF, LFCRLF, LFLF
                if (fragment.endsWith("\n\r\n")
                    || fragment.endsWith("\n\n"))
                    allHeaders = true;

                // there is another case: We have no headers. Then the fragment equals just the line ending
                if ((fragment.size() == 2 && fragment.endsWith("\r\n"))
                    || (fragment.size() == 1 && fragment.endsWith("\n")))
                    allHeaders = true;
            }
        }
    } while (!allHeaders && haveRead > 0);

    // we received all headers now parse them
    if (allHeaders) {
        parseHeader(fragment);
        state = ReadingDataState;
        fragment.clear(); // next fragment
        bodyLength = contentLength(); // cache the length

        // cache isChunked() since it is called often
        chunkedTransferEncoding = headerField("transfer-encoding").toLower().contains("chunked");

        // cache isConnectionCloseEnabled since it is called often
        QByteArray connectionHeaderField = headerField("connection");
        // check for explicit indication of close or the implicit connection close of HTTP/1.0
        connectionCloseEnabled = (connectionHeaderField.toLower().contains("close") ||
            headerField("proxy-connection").toLower().contains("close")) ||
            (parser.getMajorVersion() == 1 && parser.getMinorVersion() == 0 &&
            (connectionHeaderField.isEmpty() && !headerField("proxy-connection").toLower().contains("keep-alive")));
    }
    return bytes;
}